

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall re2::StringPiece::rfind(StringPiece *this,StringPiece *s,size_type pos)

{
  unsigned_long *puVar1;
  char *pcVar2;
  StringPiece *local_60;
  char *result;
  char *local_38;
  char *last;
  size_type ulen;
  size_type pos_local;
  StringPiece *s_local;
  StringPiece *this_local;
  
  if (this->length_ < s->length_) {
    this_local = (StringPiece *)0xffffffffffffffff;
  }
  else {
    last = (char *)(long)this->length_;
    ulen = pos;
    pos_local = (size_type)s;
    s_local = this;
    if (s->length_ == 0) {
      puVar1 = std::min<unsigned_long>((unsigned_long *)&last,&ulen);
      this_local = (StringPiece *)*puVar1;
    }
    else {
      pcVar2 = this->ptr_;
      result = last + -(long)s->length_;
      puVar1 = std::min<unsigned_long>((unsigned_long *)&result,&ulen);
      local_38 = pcVar2 + (long)*(int *)(pos_local + 8) + *puVar1;
      pcVar2 = std::find_end<char_const*,char_const*>
                         (this->ptr_,local_38,*(char **)pos_local,
                          (char *)(*(long *)pos_local + (long)*(int *)(pos_local + 8)));
      if (pcVar2 == local_38) {
        local_60 = (StringPiece *)0xffffffffffffffff;
      }
      else {
        local_60 = (StringPiece *)(pcVar2 + -(long)this->ptr_);
      }
      this_local = local_60;
    }
  }
  return (size_type)this_local;
}

Assistant:

StringPiece::size_type StringPiece::rfind(const StringPiece& s,
                                          size_type pos) const {
  if (length_ < s.length_) return npos;
  const size_type ulen = length_;
  if (s.length_ == 0) return min(ulen, pos);

  const char* last = ptr_ + min(ulen - s.length_, pos) + s.length_;
  const char* result = std::find_end(ptr_, last, s.ptr_, s.ptr_ + s.length_);
  return result != last ? result - ptr_ : npos;
}